

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlChar * xmlSchemaGetComponentTargetNs(xmlSchemaBasicItemPtr item)

{
  xmlSchemaTypeType xVar1;
  char *pcVar2;
  
  pcVar2 = "http://www.w3.org/2001/XMLSchema";
  do {
    if (item == (xmlSchemaBasicItemPtr)0x0) {
      pcVar2 = (char *)0x0;
switchD_00194630_caseD_1:
      return (xmlChar *)pcVar2;
    }
    xVar1 = item->type;
    if (xVar1 != XML_SCHEMA_TYPE_ATTRIBUTE_USE) {
      switch(xVar1) {
      case XML_SCHEMA_TYPE_BASIC:
        goto switchD_00194630_caseD_1;
      case XML_SCHEMA_TYPE_ANY:
      case XML_SCHEMA_TYPE_FACET:
      case XML_SCHEMA_TYPE_SEQUENCE:
      case XML_SCHEMA_TYPE_CHOICE:
      case XML_SCHEMA_TYPE_ALL:
      case XML_SCHEMA_TYPE_SIMPLE_CONTENT:
      case XML_SCHEMA_TYPE_COMPLEX_CONTENT:
      case XML_SCHEMA_TYPE_UR:
      case XML_SCHEMA_TYPE_RESTRICTION:
      case XML_SCHEMA_TYPE_EXTENSION:
      case XML_SCHEMA_TYPE_LIST:
      case XML_SCHEMA_TYPE_UNION:
      case XML_SCHEMA_TYPE_ANY_ATTRIBUTE:
        goto switchD_00194630_caseD_2;
      case XML_SCHEMA_TYPE_SIMPLE:
      case XML_SCHEMA_TYPE_COMPLEX:
        return *(xmlChar **)(item + 0xd);
      case XML_SCHEMA_TYPE_ELEMENT:
        return *(xmlChar **)(item + 6);
      case XML_SCHEMA_TYPE_ATTRIBUTE:
        return *(xmlChar **)(item + 7);
      case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
        return (xmlChar *)item[6].dummy;
      case XML_SCHEMA_TYPE_GROUP:
      case XML_SCHEMA_TYPE_IDC_UNIQUE:
      case XML_SCHEMA_TYPE_IDC_KEY:
      case XML_SCHEMA_TYPE_IDC_KEYREF:
        return (xmlChar *)item[2].dummy;
      default:
        if (xVar1 != XML_SCHEMA_EXTRA_QNAMEREF) {
          return (xmlChar *)0x0;
        }
      case XML_SCHEMA_TYPE_NOTATION:
        return *(xmlChar **)(item + 2);
      }
    }
    item = (xmlSchemaBasicItemPtr)item[1].dummy;
    if (item == (xmlSchemaBasicItemPtr)0x0) {
switchD_00194630_caseD_2:
      return (xmlChar *)0x0;
    }
  } while( true );
}

Assistant:

static const xmlChar *
xmlSchemaGetComponentTargetNs(xmlSchemaBasicItemPtr item)
{
    if (item == NULL) {
        return (NULL);
    }
    switch (item->type) {
	case XML_SCHEMA_TYPE_ELEMENT:
	    return (((xmlSchemaElementPtr) item)->targetNamespace);
	case XML_SCHEMA_TYPE_ATTRIBUTE:
	    return (((xmlSchemaAttributePtr) item)->targetNamespace);
	case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
	    return (((xmlSchemaAttributeGroupPtr) item)->targetNamespace);
	case XML_SCHEMA_TYPE_BASIC:
	    return (BAD_CAST "http://www.w3.org/2001/XMLSchema");
	case XML_SCHEMA_TYPE_SIMPLE:
	case XML_SCHEMA_TYPE_COMPLEX:
	    return (((xmlSchemaTypePtr) item)->targetNamespace);
	case XML_SCHEMA_TYPE_GROUP:
	    return (((xmlSchemaModelGroupDefPtr) item)->targetNamespace);
	case XML_SCHEMA_TYPE_IDC_KEY:
	case XML_SCHEMA_TYPE_IDC_UNIQUE:
	case XML_SCHEMA_TYPE_IDC_KEYREF:
	    return (((xmlSchemaIDCPtr) item)->targetNamespace);
	case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
	    if (WXS_ATTRUSE_DECL(item) != NULL) {
		return(xmlSchemaGetComponentTargetNs(
		    WXS_BASIC_CAST WXS_ATTRUSE_DECL(item)));
	    }
	    /* TODO: Will returning NULL break something? */
	    break;
	case XML_SCHEMA_EXTRA_QNAMEREF:
	    return (((xmlSchemaQNameRefPtr) item)->targetNamespace);
	case XML_SCHEMA_TYPE_NOTATION:
	    return (((xmlSchemaNotationPtr) item)->targetNamespace);
	default:
	    /*
	    * Other components cannot have names.
	    */
	    break;
    }
    return (NULL);
}